

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_36::HttpNullEntityWriter::write
          (HttpNullEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  String local_1d0;
  Exception local_1b8;
  undefined8 local_28;
  HttpNullEntityWriter *this_local;
  ArrayPtr<const_unsigned_char> buffer_local;
  
  local_28 = CONCAT44(in_register_00000034,__fd);
  this_local = (HttpNullEntityWriter *)__buf;
  buffer_local.ptr = (uchar *)__n;
  buffer_local.size_ = (size_t)this;
  kj::_::Debug::makeDescription<char_const(&)[47]>
            (&local_1d0,(Debug *)"\"HTTP message has no entity-body; can\'t write()\"",
             "HTTP message has no entity-body; can\'t write()",(char (*) [47])__n);
  Exception::Exception
            (&local_1b8,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x989,&local_1d0);
  Promise<void>::Promise((Promise<void> *)this,&local_1b8);
  Exception::~Exception(&local_1b8);
  String::~String(&local_1d0);
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    return KJ_EXCEPTION(FAILED, "HTTP message has no entity-body; can't write()");
  }